

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O2

bool __thiscall Corrade::Utility::Arguments::skippedPrefix(Arguments *this,string *key)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *prefix;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *prefix_00;
  
  prefix_00 = (this->_skippedPrefixes)._data;
  lVar1 = (this->_skippedPrefixes)._size << 6;
  do {
    lVar3 = lVar1;
    if (lVar3 == 0) break;
    bVar2 = anon_unknown_3::keyHasPrefix(key,&prefix_00->first);
    prefix_00 = prefix_00 + 1;
    lVar1 = lVar3 + -0x40;
  } while (!bVar2);
  return lVar3 != 0;
}

Assistant:

bool Arguments::skippedPrefix(const std::string& key) const {
    for(const std::pair<std::string, std::string>& prefix: _skippedPrefixes)
        if(keyHasPrefix(key, prefix.first)) return true;

    return false;
}